

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_tests.cpp
# Opt level: O2

void __thiscall
iu_AssertionTest_x_iutest_x_Pred5_Test::Body(iu_AssertionTest_x_iutest_x_Pred5_Test *this)

{
  AssertionResult iutest_ar;
  _Alloc_hider in_stack_fffffffffffffe30;
  _func_bool_int_int_int_int_int *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe60;
  
  iutest::AssertPred5Helper<bool(*)(int,int,int,int,int),int,int,int,int,int>
            ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest5,"4",
             in_stack_fffffffffffffe30._M_p,in_stack_fffffffffffffe38,in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe48,in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
             in_stack_fffffffffffffe60);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)&stack0xfffffffffffffe60,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&stack0xfffffffffffffe60);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&stack0xfffffffffffffe30,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pred_tests.cpp"
               ,0x37,iutest_ar.m_message._M_dataplus._M_p);
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&stack0xfffffffffffffe30,(Fixed *)&stack0xfffffffffffffe60);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe30);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&stack0xfffffffffffffe60);
  }
  else {
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::AssertPred5Helper<bool(*)(int,int,int,int,int),int,int,int,int,int>
              ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest5,"4",
               in_stack_fffffffffffffe30._M_p,in_stack_fffffffffffffe38,in_stack_fffffffffffffe40,
               in_stack_fffffffffffffe48,in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
               in_stack_fffffffffffffe60);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)&stack0xfffffffffffffe60,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&stack0xfffffffffffffe60);
      iutest::detail::iuCodeMessage::iuCodeMessage
                ((iuCodeMessage *)&stack0xfffffffffffffe30,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pred_tests.cpp"
                 ,0x38,iutest_ar.m_message._M_dataplus._M_p);
      iutest::AssertionHelper::operator=
                ((AssertionHelper *)&stack0xfffffffffffffe30,(Fixed *)&stack0xfffffffffffffe60);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe30);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&stack0xfffffffffffffe60);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::AssertPred5Helper<bool(*)(int,int,int,int,int),int,int,int,int,int>
              ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest5,"4",
               in_stack_fffffffffffffe30._M_p,in_stack_fffffffffffffe38,in_stack_fffffffffffffe40,
               in_stack_fffffffffffffe48,in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
               in_stack_fffffffffffffe60);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)&stack0xfffffffffffffe60,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&stack0xfffffffffffffe60);
      iutest::detail::iuCodeMessage::iuCodeMessage
                ((iuCodeMessage *)&stack0xfffffffffffffe30,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pred_tests.cpp"
                 ,0x39,iutest_ar.m_message._M_dataplus._M_p);
      iutest::AssertionHelper::operator=
                ((AssertionHelper *)&stack0xfffffffffffffe30,(Fixed *)&stack0xfffffffffffffe60);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe30);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&stack0xfffffffffffffe60);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::AssertPred5Helper<bool(*)(int,int,int,int,int),int,int,int,int,int>
              ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest5,"4",
               in_stack_fffffffffffffe30._M_p,in_stack_fffffffffffffe38,in_stack_fffffffffffffe40,
               in_stack_fffffffffffffe48,in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
               in_stack_fffffffffffffe60);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)&stack0xfffffffffffffe60,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&stack0xfffffffffffffe60);
      iutest::detail::iuCodeMessage::iuCodeMessage
                ((iuCodeMessage *)&stack0xfffffffffffffe30,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pred_tests.cpp"
                 ,0x3a,iutest_ar.m_message._M_dataplus._M_p);
      iutest::AssertionHelper::operator=
                ((AssertionHelper *)&stack0xfffffffffffffe30,(Fixed *)&stack0xfffffffffffffe60);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe30);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&stack0xfffffffffffffe60);
    }
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(AssertionTest, Pred5)
{
    IUTEST_ASSERT_PRED5(PredTest5, 0, 1, 2, 3, 4);
    IUTEST_EXPECT_PRED5(PredTest5, 0, 1, 2, 3, 4);
    IUTEST_INFORM_PRED5(PredTest5, 0, 1, 2, 3, 4);
    IUTEST_ASSUME_PRED5(PredTest5, 0, 1, 2, 3, 4);
}